

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O3

void qt_qFindChildren_helper
               (QObject *parent,QAnyStringView name,QMetaObject *mo,QList<void_*> *list,
               FindChildOptions options)

{
  QObjectData *pQVar1;
  long lVar2;
  QObject **ppQVar3;
  QObject *obj;
  _func_int **pp_Var4;
  bool bVar5;
  QObject *pQVar6;
  long lVar7;
  long in_FS_OFFSET;
  QAnyStringView lhs;
  QObject *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (parent->d_ptr).d;
  lVar2 = (pQVar1->children).d.size;
  if (lVar2 != 0) {
    ppQVar3 = (pQVar1->children).d.ptr;
    lVar7 = 0;
    do {
      obj = *(QObject **)((long)ppQVar3 + lVar7);
      pQVar6 = QMetaObject::cast(mo,obj);
      if (pQVar6 == (QObject *)0x0) goto LAB_002b0f93;
      if (name.field_0.m_data == (void *)0x0) {
LAB_002b0f75:
        local_40 = obj;
        QtPrivate::QPodArrayOps<void*>::emplace<void*&>
                  ((QPodArrayOps<void*> *)list,(list->d).size,&local_40);
        QList<void_*>::end(list);
      }
      else {
        pp_Var4 = (obj->d_ptr).d[1]._vptr_QObjectData;
        if (pp_Var4 == (_func_int **)0x0) {
          if (((undefined1  [16])name & (undefined1  [16])0x3fffffffffffffff) ==
              (undefined1  [16])0x0) goto LAB_002b0f75;
        }
        else {
          lhs.m_size = (ulong)pp_Var4[0xe] | 0x8000000000000000;
          lhs.field_0.m_data =
               ((anon_union_8_3_8ad491a7_for_QAnyStringView_6 *)(pp_Var4 + 0xd))->m_data;
          bVar5 = QAnyStringView::equal(lhs,name);
          if (bVar5) goto LAB_002b0f75;
        }
      }
LAB_002b0f93:
      if (((uint)options.super_QFlagsStorageHelper<Qt::FindChildOption,_4>.
                 super_QFlagsStorage<Qt::FindChildOption>.i & 1) != 0) {
        qt_qFindChildren_helper(obj,name,mo,list,options);
      }
      lVar7 = lVar7 + 8;
    } while (lVar2 << 3 != lVar7);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void qt_qFindChildren_helper(const QObject *parent, QAnyStringView name,
                             const QMetaObject &mo, QList<void*> *list, Qt::FindChildOptions options)
{
    Q_ASSERT(parent);
    Q_ASSERT(list);
    for (QObject *obj : parent->children()) {
        if (mo.cast(obj) && (name.isNull() || matches_objectName_non_null(obj, name)))
            list->append(obj);
        if (options & Qt::FindChildrenRecursively)
            qt_qFindChildren_helper(obj, name, mo, list, options);
    }
}